

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.h
# Opt level: O0

UninterpretedOption *
google::protobuf::DownCastMessage<google::protobuf::UninterpretedOption>(MessageLite *from)

{
  UninterpretedOption *pUVar1;
  LogMessage *pLVar2;
  GetTypeNameReturnType local_98;
  byte local_71;
  GetTypeNameReturnType local_70;
  byte local_39;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  LogMessageFatal local_28 [23];
  Voidify local_11;
  UninterpretedOption *local_10;
  MessageLite *from_local;
  
  local_10 = (UninterpretedOption *)from;
  pUVar1 = DynamicCastMessage<google::protobuf::UninterpretedOption>(from);
  local_39 = 0;
  local_71 = 0;
  if (pUVar1 != local_10) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_38,"DynamicCastMessage<T>(from) == from");
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/message_lite.h"
               ,0x55c,local_38._M_len,local_38._M_str);
    local_39 = 1;
    pLVar2 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_28);
    pLVar2 = absl::lts_20240722::log_internal::LogMessage::operator<<
                       (pLVar2,(char (*) [17])"Cannot downcast ");
    MessageLite::GetTypeName_abi_cxx11_(&local_70,(MessageLite *)local_10);
    local_71 = 1;
    pLVar2 = (LogMessage *)
             absl::lts_20240722::log_internal::LogMessage::operator<<(pLVar2,(string *)&local_70);
    pLVar2 = absl::lts_20240722::log_internal::LogMessage::operator<<(pLVar2,(char (*) [5])" to ");
    pUVar1 = UninterpretedOption::default_instance();
    MessageLite::GetTypeName_abi_cxx11_(&local_98,(MessageLite *)pUVar1);
    pLVar2 = (LogMessage *)
             absl::lts_20240722::log_internal::LogMessage::operator<<(pLVar2,(string *)&local_98);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_11,pLVar2);
    std::__cxx11::string::~string((string *)&local_98);
  }
  if ((local_71 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_70);
  }
  if ((local_39 & 1) == 0) {
    return local_10;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_28);
}

Assistant:

const T* DownCastMessage(const MessageLite* from) {
  internal::StrongReferenceToType<T>();
  ABSL_DCHECK(DynamicCastMessage<T>(from) == from)
      << "Cannot downcast " << from->GetTypeName() << " to "
      << T::default_instance().GetTypeName();
  return static_cast<const T*>(from);
}